

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrapper.hpp
# Opt level: O2

void __thiscall Diligent::FileWrapper::Open(FileWrapper *this,FileOpenAttribs *OpenAttribs)

{
  LinuxFile *pLVar1;
  string msg;
  
  if (this->m_pFile != (CFile *)0x0) {
    FormatString<char[30]>(&msg,(char (*) [30])"Another file already attached");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Open",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FileWrapper.hpp"
               ,0x3e);
    std::__cxx11::string::~string((string *)&msg);
  }
  Close(this);
  pLVar1 = LinuxFileSystem::OpenFile(OpenAttribs);
  this->m_pFile = pLVar1;
  return;
}

Assistant:

void Open(const FileOpenAttribs& OpenAttribs)
    {
        VERIFY(!m_pFile, "Another file already attached");
        Close();
        m_pFile = FileSystem::OpenFile(OpenAttribs);
    }